

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O1

int32_t __thiscall fasttext::Dictionary::find(Dictionary *this,string *w)

{
  int32_t iVar1;
  uint h;
  size_type sVar2;
  
  if (w->_M_string_length != 0) {
    h = 0x811c9dc5;
    sVar2 = 0;
    do {
      h = ((int)(w->_M_dataplus)._M_p[sVar2] ^ h) * 0x1000193;
      sVar2 = sVar2 + 1;
    } while (w->_M_string_length != sVar2);
    iVar1 = find(this,w,h);
    return iVar1;
  }
  iVar1 = find(this,w,0x811c9dc5);
  return iVar1;
}

Assistant:

int32_t Dictionary::find(const std::string& w) const {
	return find(w, hash(w));
}